

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::QHttp2ProtocolHandler
          (QHttp2ProtocolHandler *this,QHttpNetworkConnectionChannel *channel)

{
  long lVar1;
  void **ppvVar2;
  ConnectionType CVar3;
  QHttp2Connection *pQVar4;
  QHttp2Stream *stream;
  undefined4 *puVar5;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff8c;
  QObject local_60 [8];
  undefined1 local_58 [16];
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> local_48;
  QHttp2Configuration h2Config;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,(QObject *)0x0);
  QAbstractProtocolHandler::QAbstractProtocolHandler
            ((QAbstractProtocolHandler *)(this + 0x10),channel);
  *(undefined ***)this = &PTR_metaObject_002cd0b0;
  *(undefined ***)(this + 0x10) = &PTR__QHttp2ProtocolHandler_002cd138;
  this[0x40] = (QHttp2ProtocolHandler)0x0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  h2Config.d.d.ptr = (QSharedDataPointer<QHttp2ConfigurationPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHttpNetworkConnection::http2Parameters((QHttpNetworkConnection *)&h2Config);
  if (channel->ssl == false) {
    CVar3 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0x30));
    if (CVar3 != ConnectionTypeHTTP2Direct) {
      pQVar4 = QHttp2Connection::createUpgradedConnection(channel->socket,&h2Config);
      *(QHttp2Connection **)(this + 0x38) = pQVar4;
      stream = QHttp2Connection::getStream((QHttp2Connection *)pQVar4,1);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::
      pair<QHttpNetworkRequest_&,_QHttpNetworkReply_*&,_true>
                (&local_48,&channel->request,&channel->reply);
      connectStream(this,&local_48,stream);
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_48.first);
      pQVar4 = *(QHttp2Connection **)(this + 0x38);
      goto LAB_001e00c3;
    }
  }
  pQVar4 = QHttp2Connection::createDirectConnection(channel->socket,&h2Config);
  *(QHttp2Connection **)(this + 0x38) = pQVar4;
LAB_001e00c3:
  local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)handleGOAWAY;
  local_48.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
  QObject::
  connect<void(QHttp2Connection::*)(Http2::Http2Error,unsigned_int),void(QHttp2ProtocolHandler::*)(Http2::Http2Error,unsigned_int)>
            ((Object *)(local_58 + 8),(offset_in_QHttp2Connection_to_subr)pQVar4,
             (ContextType *)QHttp2Connection::receivedGOAWAY,
             (offset_in_QHttp2ProtocolHandler_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)(local_58 + 8));
  local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)connectionError;
  local_48.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
  QObject::
  connect<void(QHttp2Connection::*)(Http2::Http2Error,QString_const&),void(QHttp2ProtocolHandler::*)(Http2::Http2Error,QString_const&)>
            ((Object *)local_58,*(offset_in_QHttp2Connection_to_subr *)(this + 0x38),
             (ContextType *)QHttp2Connection::errorOccurred,
             (offset_in_QHttp2ProtocolHandler_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  ppvVar2 = *(void ***)(this + 0x38);
  local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)QHttp2Connection::newIncomingStream;
  local_48.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttp2protocolhandler.cpp:133:13),_QtPrivate::List<QHttp2Stream_*>,_void>
       ::impl;
  *(QHttp2ProtocolHandler **)(puVar5 + 4) = this;
  QObject::connectImpl
            (local_60,ppvVar2,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)((ulong)in_stack_ffffffffffffff8c << 0x20),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QHttp2Configuration::~QHttp2Configuration(&h2Config);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2ProtocolHandler::QHttp2ProtocolHandler(QHttpNetworkConnectionChannel *channel)
    : QAbstractProtocolHandler(channel)
{
    const auto h2Config = m_connection->http2Parameters();

    if (!channel->ssl
        && m_connection->connectionType() != QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
        h2Connection = QHttp2Connection::createUpgradedConnection(channel->socket, h2Config);
        // Since we upgraded there is already one stream (the request was sent as http1)
        // and we need to handle it:
        QHttp2Stream *stream = h2Connection->getStream(1);
        Q_ASSERT(stream);
        Q_ASSERT(channel->reply);
        connectStream({ channel->request, channel->reply }, stream);
    } else {
        Q_ASSERT(QSocketAbstraction::socketState(channel->socket) == QAbstractSocket::ConnectedState);
        h2Connection = QHttp2Connection::createDirectConnection(channel->socket, h2Config);
    }
    connect(h2Connection, &QHttp2Connection::receivedGOAWAY, this,
            &QHttp2ProtocolHandler::handleGOAWAY);
    connect(h2Connection, &QHttp2Connection::errorOccurred, this,
            &QHttp2ProtocolHandler::connectionError);
    connect(h2Connection, &QHttp2Connection::newIncomingStream, this,
            [this](QHttp2Stream *stream){
                // Having our peer start streams doesn't make sense. We are
                // doing regular http request-response.
                stream->sendRST_STREAM(REFUSE_STREAM);
                if (!h2Connection->isGoingAway())
                    h2Connection->close(Http2::PROTOCOL_ERROR);
            });
}